

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O2

void __thiscall
booster::aio::anon_unknown_3::async_acceptor::operator()(async_acceptor *this,error_code *e)

{
  bool bVar1;
  socklen_t *in_RCX;
  error_code reserr;
  error_code local_20;
  
  if (e->_M_value != 0) {
    callback<void_(const_std::error_code_&)>::operator()(&this->h,e);
    return;
  }
  local_20._M_value = 0;
  local_20._M_cat = (error_category *)std::_V2::system_category();
  acceptor::accept(this->source,(int)this->target,(sockaddr *)&local_20,in_RCX);
  bVar1 = basic_io_device::would_block(&local_20);
  if (bVar1) {
    acceptor::async_accept(this->source,this->target,&this->h);
  }
  else {
    callback<void_(const_std::error_code_&)>::operator()(&this->h,&local_20);
  }
  return;
}

Assistant:

void operator()(system::error_code const &e)
		{
			if(e) { h(e); return; }
			system::error_code reserr;
			source->accept(*target,reserr);
			if(basic_io_device::would_block(reserr)) {
				source->async_accept(*target,h);
			}
			else
				h(reserr);
		}